

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# figures.cpp
# Opt level: O1

void __thiscall agge::rounded_rectangle::setup_bezier(rounded_rectangle *this,uint state)

{
  float fVar1;
  float fVar2;
  float fVar3;
  real_t rVar4;
  
  switch(state) {
  case 0:
    fVar2 = this->_points[0].x;
    this->_xb = fVar2;
    fVar3 = this->_points[0].y;
    this->_yb = fVar3 + this->_ry;
    this->_xc1 = fVar2;
    this->_yc1 = this->_ry * 0.44808495 + fVar3;
    this->_xc2 = this->_rx * 0.44808495 + fVar2;
    this->_yc2 = fVar3;
    rVar4 = fVar2 + this->_rx;
    goto LAB_0019949f;
  default:
    goto switchD_00199348_caseD_1;
  case 2:
    fVar2 = this->_points[1].x;
    fVar3 = this->_rx;
    fVar1 = this->_points[0].y;
    this->_xb = fVar2 - fVar3;
    this->_yb = fVar1;
    this->_xc1 = fVar2 - fVar3 * 0.44808495;
    this->_yc1 = fVar1;
    this->_xc2 = fVar2;
    this->_yc2 = this->_ry * 0.44808495 + fVar1;
    this->_xe = fVar2;
    fVar3 = fVar3 + fVar1;
    break;
  case 4:
    fVar2 = this->_points[0].x;
    this->_xb = fVar2 + this->_rx;
    fVar3 = this->_points[1].y;
    this->_yb = fVar3;
    this->_xc1 = this->_rx * 0.44808495 + fVar2;
    this->_yc1 = fVar3;
    this->_xc2 = fVar2;
    this->_yc2 = fVar3 - this->_ry * 0.44808495;
    this->_xe = fVar2;
    fVar3 = fVar3 - this->_ry;
    break;
  case 6:
    fVar2 = this->_points[1].x;
    this->_xb = fVar2;
    fVar3 = this->_points[1].y;
    this->_yb = fVar3 - this->_ry;
    this->_xc1 = fVar2;
    this->_yc1 = fVar3 - this->_ry * 0.44808495;
    this->_xc2 = fVar2 - this->_rx * 0.44808495;
    this->_yc2 = fVar3;
    rVar4 = fVar2 - this->_rx;
LAB_0019949f:
    this->_xe = rVar4;
  }
  this->_ye = fVar3;
switchD_00199348_caseD_1:
  this->_t = 0.0;
  return;
}

Assistant:

void rounded_rectangle::setup_bezier(unsigned state)
	{
		const real_t k_ = 1.0f - c_qarc_bezier_k;

		switch (state)
		{
		case left | top:
			_xb = _points[0].x, _yb = _points[0].y + _ry;
			_xc1 = _points[0].x, _yc1 = _points[0].y + k_ * _ry;
			_xc2 = _points[0].x + k_ * _rx, _yc2 = _points[0].y;
			_xe = _points[0].x + _rx, _ye = _points[0].y;
			break;

		case right | top:
			_xb = _points[1].x - _rx, _yb = _points[0].y;
			_xc1 = _points[1].x - k_ * _rx, _yc1 = _points[0].y;
			_xc2 = _points[1].x, _yc2 = _points[0].y + k_ * _ry;
			_xe = _points[1].x, _ye = _points[0].y + _rx;
			break;

		case right | bottom:
			_xb = _points[1].x, _yb = _points[1].y - _ry;
			_xc1 = _points[1].x, _yc1 = _points[1].y - k_ * _ry;
			_xc2 = _points[1].x - k_ * _rx, _yc2 = _points[1].y;
			_xe = _points[1].x - _rx, _ye = _points[1].y;
			break;

		case left | bottom:
			_xb = _points[0].x + _rx, _yb = _points[1].y;
			_xc1 = _points[0].x + k_ * _rx, _yc1 = _points[1].y;
			_xc2 = _points[0].x, _yc2 = _points[1].y - k_ * _ry;
			_xe = _points[0].x, _ye = _points[1].y - _ry;
			break;
		}
		_t = 0.0f;
	}